

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O0

Import * __thiscall flatbuffers::python::Imports::Import(Imports *this,string *module,string *name)

{
  reference pvVar1;
  undefined1 local_60 [8];
  Import import;
  string *name_local;
  string *module_local;
  Imports *this_local;
  
  import.name.field_2._8_8_ = name;
  python::Import::Import((Import *)local_60);
  std::__cxx11::string::operator=((string *)local_60,(string *)module);
  std::__cxx11::string::operator=
            ((string *)(import.module.field_2._M_local_buf + 8),(string *)import.name.field_2._8_8_)
  ;
  std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::push_back
            (&this->imports,(value_type *)local_60);
  pvVar1 = std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::
           back(&this->imports);
  python::Import::~Import((Import *)local_60);
  return pvVar1;
}

Assistant:

const python::Import &python::Imports::Import(const std::string &module,
                                              const std::string &name) {
  python::Import import;
  import.module = module;
  import.name = name;
  imports.push_back(std::move(import));
  return imports.back();
}